

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

void __thiscall
OpenMD::
AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>::
AndParamConstraint(AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>
                   *this,GreaterThanOrEqualTo<int> *cons1,LessThanOrEqualToConstraint<int> *cons2)

{
  ostream *poVar1;
  string *in_RDI;
  stringstream iss;
  GreaterThanOrEqualTo<int> *in_stack_fffffffffffffda8;
  GreaterThanOrEqualTo<int> *in_stack_fffffffffffffdb0;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  stringstream local_1b0 [16];
  ostream local_1a0 [416];
  
  ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>_>
  ::ParamConstraintFacade
            ((ParamConstraintFacade<OpenMD::AndParamConstraint<OpenMD::GreaterThanOrEqualTo<int>,_OpenMD::LessThanOrEqualToConstraint<int>_>_>
              *)0x25f00b);
  GreaterThanOrEqualTo<int>::GreaterThanOrEqualTo
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  LessThanOrEqualToConstraint<int>::LessThanOrEqualToConstraint
            ((LessThanOrEqualToConstraint<int> *)in_stack_fffffffffffffdb0,
             (LessThanOrEqualToConstraint<int> *)in_stack_fffffffffffffda8);
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,"(");
  ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>>::getConstraintDescription_abi_cxx11_
            (&in_stack_fffffffffffffda8->
              super_ParamConstraintFacade<OpenMD::GreaterThanOrEqualTo<int>_>);
  poVar1 = std::operator<<(poVar1,local_1d0);
  poVar1 = std::operator<<(poVar1," and ");
  ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>>::
  getConstraintDescription_abi_cxx11_
            ((ParamConstraintFacade<OpenMD::LessThanOrEqualToConstraint<int>_> *)
             in_stack_fffffffffffffda8);
  poVar1 = std::operator<<(poVar1,local_1f0);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=(in_RDI,local_210);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

AndParamConstraint(Cons1T cons1, Cons2T cons2) :
        cons1_(cons1), cons2_(cons2) {
      std::stringstream iss;
      iss << "(" << cons1_.getConstraintDescription() << " and "
          << cons2_.getConstraintDescription() << ")";
      this->description_ = iss.str();
    }